

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

void cpu_ppc_store_tbl_ppc64(CPUPPCState_conflict2 *env,uint32_t value)

{
  ppc_tb_t *tb_env_00;
  uint64_t uVar1;
  uint64_t vmclk;
  uint64_t tb;
  ppc_tb_t *tb_env;
  uint32_t value_local;
  CPUPPCState_conflict2 *env_local;
  
  tb_env_00 = env->tb_env;
  uVar1 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  uVar1 = cpu_ppc_get_tb_ppc64(tb_env_00,uVar1,tb_env_00->tb_offset);
  vmclk = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  cpu_ppc_store_tb(tb_env_00,vmclk,&tb_env_00->tb_offset,uVar1 & 0xffffffff00000000 | (ulong)value);
  return;
}

Assistant:

void cpu_ppc_store_tbl (CPUPPCState *env, uint32_t value)
{
    ppc_tb_t *tb_env = env->tb_env;
    uint64_t tb;

    tb = cpu_ppc_get_tb(tb_env, qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL), tb_env->tb_offset);
    tb &= 0xFFFFFFFF00000000ULL;
    cpu_ppc_store_tb(tb_env, qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL),
                     &tb_env->tb_offset, tb | (uint64_t)value);
}